

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O3

void k051649_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  DEV_SMPL DVar5;
  DEV_SMPL *__s;
  DEV_SMPL *pDVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  __s = *outputs;
  pDVar6 = outputs[1];
  uVar12 = (ulong)samples;
  lVar10 = 0;
  memset(__s,0,uVar12 * 4);
  do {
    iVar2 = *(int *)((long)param + lVar10 * 0x2c + 0xc);
    if ((8 < iVar2) &&
       (puVar8 = (uint *)((long)param + lVar10 * 0x2c + 8), *(char *)((long)puVar8 + 0x2a) == '\0'))
    {
      uVar9 = *puVar8;
      if (samples != 0) {
        uVar3 = *(uint *)((long)param + 0xe4);
        iVar4 = *(int *)((long)param + 0xe8);
        uVar7 = puVar8[2];
        bVar1 = *(byte *)((long)puVar8 + 9);
        uVar11 = 0;
        do {
          uVar9 = uVar9 + (int)(long)((float)((ulong)uVar3 << 0x10) /
                                      ((float)(uint)((iVar2 + 1) * iVar4) * 0.5) + 0.5);
          __s[uVar11] = __s[uVar11] +
                        ((int)*(char *)((long)puVar8 + (ulong)(uVar9 >> 0x10 & 0x1f) + 10) *
                         (int)(short)((ushort)bVar1 * (ushort)(byte)uVar7) >> 3);
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      *puVar8 = uVar9;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  if (samples != 0) {
    lVar10 = *(long *)((long)param + 0xf8);
    uVar11 = 0;
    do {
      DVar5 = *(DEV_SMPL *)(lVar10 + (long)__s[uVar11] * 4);
      pDVar6[uVar11] = DVar5;
      __s[uVar11] = DVar5;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  return;
}

Assistant:

static void k051649_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k051649_state *info = (k051649_state *)param;
	k051649_sound_channel *voice=info->channel_list;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];
	UINT32 i,j;

	// zap the contents of the mixer buffer
	memset(buffer, 0, samples * sizeof(DEV_SMPL));

	for (j = 0; j < 5; j++)
	{
		// channel is halted for freq < 9
		if (voice[j].frequency > 8 && ! voice[j].Muted)
		{
			const INT8 *w = voice[j].waveram;
			INT16 v=voice[j].volume * voice[j].key;
			UINT32 c=voice[j].counter;
			//UINT32 step = (UINT32)(((INT64)info->mclock * (1 << FREQ_BITS)) / (float)((voice[j].frequency + 1) * 16 * (info->rate / 32)) + 0.5);
			UINT32 step = (UINT32)(((INT64)info->mclock * (1 << FREQ_BITS)) / (float)((voice[j].frequency + 1) * info->rate / 2.0f) + 0.5f);

			// add our contribution
			for (i = 0; i < samples; i++)
			{
				UINT32 offs;

				c += step;
				offs = (c >> FREQ_BITS) & 0x1f;
				buffer[i] += (w[offs] * v)>>3;
			}

			// update the counter for this voice
			voice[j].counter = c;
		}
	}

	// mix it down
	for (i = 0; i < samples; i++)
	{
		buffer[i] = buffer2[i] = info->mixer_lookup[buffer[i]];
	}
}